

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

Entry * __thiscall
wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
          (Entry *this,HeapType type,anon_class_8_1_911e227b map)

{
  Entry *this_local;
  anon_class_8_1_911e227b map_local;
  HeapType type_local;
  
  copyHeapType<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
            (this->builder,this->index,type,map);
  return this;
}

Assistant:

Entry& copy(HeapType type, F map) {
      builder.copyHeapType(index, type, map);
      return *this;
    }